

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sspm.cpp
# Opt level: O3

void __thiscall pg::SSPMSolver::stream_pm(SSPMSolver *this,ostream *out,int idx)

{
  long lVar1;
  int iVar2;
  char *pcVar3;
  int iVar4;
  long lVar5;
  int iVar6;
  long lVar7;
  
  lVar1 = (long)idx * (long)this->l;
  if (this->pm_d[lVar1] == -1) {
    pcVar3 = " \x1b[1;33mTop\x1b[m";
    lVar1 = 0xe;
  }
  else {
    std::__ostream_insert<char,std::char_traits<char>>(out," { ",3);
    if (0 < this->h) {
      iVar2 = 0;
      iVar6 = 0;
      do {
        if (iVar2 != 0) {
          std::__ostream_insert<char,std::char_traits<char>>(out,",",1);
        }
        if (iVar6 < this->l) {
          lVar5 = (long)iVar6;
          iVar4 = 0;
          lVar7 = lVar1 + lVar5;
          do {
            if (this->pm_d[lVar7] != iVar2) {
              iVar6 = iVar6 - iVar4;
              if (iVar4 == 0) goto LAB_00166860;
              goto LAB_00166874;
            }
            std::ostream::_M_insert<bool>(SUB81(out,0));
            lVar5 = lVar5 + 1;
            iVar4 = iVar4 + -1;
            lVar7 = lVar7 + 1;
          } while (lVar5 < this->l);
          iVar6 = iVar6 - iVar4;
        }
        else {
LAB_00166860:
          std::__ostream_insert<char,std::char_traits<char>>(out,anon_var_dwarf_230e1b,2);
        }
LAB_00166874:
        iVar2 = iVar2 + 1;
      } while (iVar2 < this->h);
    }
    pcVar3 = " }";
    lVar1 = 2;
  }
  std::__ostream_insert<char,std::char_traits<char>>(out,pcVar3,lVar1);
  return;
}

Assistant:

void
SSPMSolver::stream_pm(std::ostream &out, int idx)
{
    int base = idx*l;
    if (pm_d[base] == -1) {
        out << " \033[1;33mTop\033[m";
    } else {
        out << " { ";
        int j=0;
        for (int i=0; i<h; i++) {
            if (i>0) out << ",";
            int c=0;
            while (j<l and pm_d[base+j] == i) {
                c++;
                out << pm_b[base+j];
                j++;
            }
            if (c == 0) out << "ε";
        }
        out << " }";
    }
}